

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O3

int rsa_rsassa_pkcs1_v15_encode
              (mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,size_t dst_len,uchar *dst)

{
  uchar *__dest;
  uchar uVar1;
  size_t __n;
  size_t sVar2;
  uchar *puVar3;
  byte bVar4;
  int iVar5;
  mbedtls_md_info_t *md_info;
  ulong uVar6;
  ulong __n_00;
  char *oid;
  size_t oid_size;
  char *local_50;
  size_t local_48;
  size_t local_40;
  uchar *local_38;
  
  __n_00 = (ulong)hashlen;
  local_48 = 0;
  local_50 = (char *)0x0;
  if (md_alg == MBEDTLS_MD_NONE) {
    uVar6 = __n_00;
    if (dst_len < __n_00) {
      return -0x4080;
    }
  }
  else {
    md_info = mbedtls_md_info_from_type(md_alg);
    bVar4 = mbedtls_md_get_size(md_info);
    if (bVar4 == 0) {
      return -0x4080;
    }
    iVar5 = mbedtls_oid_get_oid_by_md(md_alg,&local_50,&local_48);
    if (bVar4 != hashlen) {
      return -0x4080;
    }
    if (iVar5 != 0) {
      return -0x4080;
    }
    if (0x7f < __n_00 + local_48 + 8) {
      return -0x4080;
    }
    uVar6 = local_48 + __n_00 + 10;
    if (uVar6 < __n_00 + 10 || dst_len < uVar6) {
      return -0x4080;
    }
  }
  __n = local_48;
  uVar6 = dst_len - uVar6;
  iVar5 = -0x4080;
  if (10 < uVar6) {
    dst[0] = '\0';
    dst[1] = '\x01';
    local_38 = dst + 2;
    switchD_01043a80::default(local_38,0xff,uVar6 - 3);
    puVar3 = local_38;
    dst[uVar6 - 1] = '\0';
    if (md_alg == MBEDTLS_MD_NONE) {
      switchD_015de399::default(dst + uVar6,hash,__n_00);
    }
    else {
      dst[uVar6] = '0';
      uVar1 = (uchar)__n;
      dst[uVar6 + 1] = uVar1 + (uchar)hashlen + '\b';
      dst[uVar6 + 2] = '0';
      dst[uVar6 + 3] = uVar1 + '\x04';
      dst[uVar6 + 4] = '\x06';
      dst[uVar6 + 5] = uVar1;
      local_40 = __n_00;
      switchD_015de399::default(local_38 + uVar6 + 4,local_50,__n);
      sVar2 = local_40;
      __dest = puVar3 + __n + 8 + uVar6;
      __dest[-4] = '\x05';
      __dest[-3] = '\0';
      __dest[-2] = '\x04';
      __dest[-1] = (uchar)hashlen;
      switchD_015de399::default(__dest,hash,local_40);
      if (puVar3 + sVar2 + __n + uVar6 + 8 != dst + dst_len) {
        mbedtls_platform_zeroize(dst,dst_len);
        return -0x4080;
      }
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int rsa_rsassa_pkcs1_v15_encode(mbedtls_md_type_t md_alg,
                                       unsigned int hashlen,
                                       const unsigned char *hash,
                                       size_t dst_len,
                                       unsigned char *dst)
{
    size_t oid_size  = 0;
    size_t nb_pad    = dst_len;
    unsigned char *p = dst;
    const char *oid  = NULL;

    /* Are we signing hashed or raw data? */
    if (md_alg != MBEDTLS_MD_NONE) {
        unsigned char md_size = mbedtls_md_get_size_from_type(md_alg);
        if (md_size == 0) {
            return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        }

        if (mbedtls_oid_get_oid_by_md(md_alg, &oid, &oid_size) != 0) {
            return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        }

        if (hashlen != md_size) {
            return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        }

        /* Double-check that 8 + hashlen + oid_size can be used as a
         * 1-byte ASN.1 length encoding and that there's no overflow. */
        if (8 + hashlen + oid_size  >= 0x80         ||
            10 + hashlen            <  hashlen      ||
            10 + hashlen + oid_size <  10 + hashlen) {
            return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        }

        /*
         * Static bounds check:
         * - Need 10 bytes for five tag-length pairs.
         *   (Insist on 1-byte length encodings to protect against variants of
         *    Bleichenbacher's forgery attack against lax PKCS#1v1.5 verification)
         * - Need hashlen bytes for hash
         * - Need oid_size bytes for hash alg OID.
         */
        if (nb_pad < 10 + hashlen + oid_size) {
            return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        }
        nb_pad -= 10 + hashlen + oid_size;
    } else {
        if (nb_pad < hashlen) {
            return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
        }

        nb_pad -= hashlen;
    }

    /* Need space for signature header and padding delimiter (3 bytes),
     * and 8 bytes for the minimal padding */
    if (nb_pad < 3 + 8) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }
    nb_pad -= 3;

    /* Now nb_pad is the amount of memory to be filled
     * with padding, and at least 8 bytes long. */

    /* Write signature header and padding */
    *p++ = 0;
    *p++ = MBEDTLS_RSA_SIGN;
    memset(p, 0xFF, nb_pad);
    p += nb_pad;
    *p++ = 0;

    /* Are we signing raw data? */
    if (md_alg == MBEDTLS_MD_NONE) {
        memcpy(p, hash, hashlen);
        return 0;
    }

    /* Signing hashed data, add corresponding ASN.1 structure
     *
     * DigestInfo ::= SEQUENCE {
     *   digestAlgorithm DigestAlgorithmIdentifier,
     *   digest Digest }
     * DigestAlgorithmIdentifier ::= AlgorithmIdentifier
     * Digest ::= OCTET STRING
     *
     * Schematic:
     * TAG-SEQ + LEN [ TAG-SEQ + LEN [ TAG-OID  + LEN [ OID  ]
     *                                 TAG-NULL + LEN [ NULL ] ]
     *                 TAG-OCTET + LEN [ HASH ] ]
     */
    *p++ = MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED;
    *p++ = (unsigned char) (0x08 + oid_size + hashlen);
    *p++ = MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED;
    *p++ = (unsigned char) (0x04 + oid_size);
    *p++ = MBEDTLS_ASN1_OID;
    *p++ = (unsigned char) oid_size;
    memcpy(p, oid, oid_size);
    p += oid_size;
    *p++ = MBEDTLS_ASN1_NULL;
    *p++ = 0x00;
    *p++ = MBEDTLS_ASN1_OCTET_STRING;
    *p++ = (unsigned char) hashlen;
    memcpy(p, hash, hashlen);
    p += hashlen;

    /* Just a sanity-check, should be automatic
     * after the initial bounds check. */
    if (p != dst + dst_len) {
        mbedtls_platform_zeroize(dst, dst_len);
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    return 0;
}